

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O0

void __thiscall tt::net::Epoll::Epoll(Epoll *this)

{
  int iVar1;
  shared_ptr<tt::net::HttpData> *local_68;
  shared_ptr<tt::net::Channel> *local_48;
  allocator<epoll_event> local_11;
  Epoll *local_10;
  Epoll *this_local;
  
  local_10 = this;
  iVar1 = epoll_create1(0x80000);
  this->m_epollFd = iVar1;
  std::allocator<epoll_event>::allocator(&local_11);
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->m_events,0x1000,&local_11);
  std::allocator<epoll_event>::~allocator(&local_11);
  local_48 = this->m_fd2chan;
  do {
    std::shared_ptr<tt::net::Channel>::shared_ptr(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (shared_ptr<tt::net::Channel> *)this->m_fd2http);
  local_68 = this->m_fd2http;
  do {
    std::shared_ptr<tt::net::HttpData>::shared_ptr(local_68);
    local_68 = local_68 + 1;
  } while ((TimerManager *)local_68 != &this->m_timeManager);
  TimerManager::TimerManager(&this->m_timeManager);
  if (0 < this->m_epollFd) {
    return;
  }
  __assert_fail("m_epollFd > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/Epoll.cc"
                ,0x1b,"tt::net::Epoll::Epoll()");
}

Assistant:

Epoll::Epoll()
	:m_epollFd(epoll_create1(EPOLL_CLOEXEC)),
	m_events(EVENTSNUM){
	
	assert(m_epollFd > 0);	
}